

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::ElemSegment::ElemSegment(ElemSegment *this,string_view name)

{
  string_view name_local;
  Location local_28;
  
  name_local.size_ = name.size_;
  name_local.data_ = name.data_;
  this->kind = Active;
  string_view::to_string_abi_cxx11_(&this->name,&name_local);
  local_28.field_1.field_0.line = 0;
  local_28.field_1._4_8_ = 0;
  local_28.filename.data_ = (char *)0x0;
  local_28.filename.size_._0_4_ = 0;
  local_28.filename.size_._4_4_ = 0;
  Var::Var(&this->table_var,0xffffffff,&local_28);
  (this->elem_exprs).super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->elem_exprs).super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->offset).size_ = 0;
  (this->elem_exprs).super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->offset).first_ = (Expr *)0x0;
  (this->offset).last_ = (Expr *)0x0;
  return;
}

Assistant:

explicit ElemSegment(string_view name) : name(name.to_string()) {}